

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::remap_color_endpoints
               (uint16 *remapping,unpacked_endpoint *unpacked_endpoints,uint *hist,uint16 n,
               uint16 selected,float weight)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Node *pNVar8;
  unsigned_short *puVar9;
  ulong uVar10;
  ushort in_CX;
  ulong uVar11;
  long in_RDX;
  long in_RDI;
  unsigned_short in_R8W;
  bool bVar12;
  float in_XMM0_Da;
  uint16 i_2;
  Node *best_node;
  int scale;
  int back;
  int front;
  uint frequency_back;
  uint frequency_front;
  uint64 value;
  Node *node;
  uint i_1;
  uint best_index;
  uint64 best_value;
  uint frequency_normalizer;
  uint similarity_base;
  uint *frequency;
  bool back_updated;
  bool front_updated;
  unpacked_endpoint back_e;
  unpacked_endpoint front_e;
  uint chosen_back;
  uint chosen_front;
  uint remaining_count;
  vector<unsigned_short> chosen;
  uint16 i;
  vector<Node> remaining;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  undefined6 in_stack_fffffffffffffe40;
  short in_stack_fffffffffffffe46;
  undefined8 in_stack_fffffffffffffe48;
  long lVar13;
  color_quad_u8 *in_stack_fffffffffffffe50;
  Node *in_stack_fffffffffffffe58;
  ushort local_ca;
  int local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_98;
  uint local_94;
  int local_88;
  long local_80;
  bool local_75;
  uint local_64;
  uint local_60;
  uint local_5c;
  vector<unsigned_short> local_58 [2];
  ushort local_32;
  vector<Node> local_30;
  float local_20;
  unsigned_short local_1c;
  ushort local_1a;
  long local_18;
  long local_8;
  
  local_20 = in_XMM0_Da;
  local_1c = in_R8W;
  local_1a = in_CX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  vector<Node>::vector
            ((vector<Node> *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
             in_stack_fffffffffffffe3c);
  for (local_32 = 0; local_32 < local_1a; local_32 = local_32 + 1) {
    uVar3 = (uint)local_32;
    pNVar8 = vector<Node>::operator[](&local_30,uVar3);
    pNVar8->index = uVar3;
    vector<Node>::operator[](&local_30,(uint)local_32);
    optimize_color_params::unpacked_endpoint::operator=
              ((unpacked_endpoint *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
               (unpacked_endpoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  vector<unsigned_short>::vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)
             ,in_stack_fffffffffffffe3c);
  uVar2 = local_1c;
  uVar3 = (uint)local_1a;
  local_64 = (uint)local_1a;
  puVar9 = vector<unsigned_short>::operator[](local_58,local_64);
  *puVar9 = uVar2;
  vector<Node>::operator[](&local_30,(uint)local_1c);
  optimize_color_params::unpacked_endpoint::unpacked_endpoint
            ((unpacked_endpoint *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
             (unpacked_endpoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  optimize_color_params::unpacked_endpoint::unpacked_endpoint
            ((unpacked_endpoint *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
             (unpacked_endpoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_75 = true;
  bVar1 = true;
  local_5c = uVar3 - 1;
  vector<Node>::operator[](&local_30,local_5c);
  vector<Node>::operator[](&local_30,(uint)local_1c);
  remap_color_endpoints::Node::operator=
            ((Node *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
             (Node *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_80 = local_18 + (long)(int)((uint)local_1c * (uint)local_1a) * 4;
  iVar4 = (int)(long)((local_20 + 1.0) * 4000.0);
  local_88 = 0;
  local_60 = local_64;
  while (local_5c != 0) {
    uVar3 = 0;
    local_94 = 0;
    for (local_98 = 0; local_98 < local_5c; local_98 = local_98 + 1) {
      pNVar8 = vector<Node>::operator[](&local_30,local_98);
      pNVar8->frequency = *(int *)(local_80 + (ulong)pNVar8->index * 4) + pNVar8->frequency;
      if (local_75) {
        uVar5 = color::elucidian_distance
                          ((color_quad_u8 *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
        uVar6 = color::elucidian_distance
                          ((color_quad_u8 *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
        uVar7 = math::minimum<unsigned_int>(4000,uVar5 + uVar6);
        pNVar8->front_similarity = iVar4 - uVar7;
      }
      if (bVar1) {
        uVar5 = color::elucidian_distance
                          ((color_quad_u8 *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
        uVar6 = color::elucidian_distance
                          ((color_quad_u8 *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
        uVar7 = math::minimum<unsigned_int>(4000,uVar5 + uVar6);
        pNVar8->back_similarity = iVar4 - uVar7;
      }
      uVar7 = math::maximum<unsigned_int>(pNVar8->front_similarity,pNVar8->back_similarity);
      uVar7 = uVar7 * (pNVar8->frequency + local_88) + 1;
      if ((uVar3 < uVar7) || ((uVar7 == uVar3 && (pNVar8->index < (uint)local_1c)))) {
        local_94 = local_98;
        local_1c = (unsigned_short)pNVar8->index;
        uVar3 = uVar7;
      }
    }
    local_80 = local_18 + (long)(int)((uint)local_1c * (uint)local_1a) * 4;
    local_ac = 0;
    local_b0 = 0;
    local_b4 = local_60;
    local_b8 = local_64;
    for (local_bc = local_64 - local_60; 0 < local_bc; local_bc = local_bc + -2) {
      puVar9 = vector<unsigned_short>::operator[](local_58,local_b4);
      local_ac = local_ac + local_bc * *(int *)(local_80 + (ulong)*puVar9 * 4);
      puVar9 = vector<unsigned_short>::operator[](local_58,local_b8);
      local_b0 = local_bc * *(int *)(local_80 + (ulong)*puVar9 * 4) + local_b0;
      local_b4 = local_b4 + 1;
      local_b8 = local_b8 - 1;
    }
    pNVar8 = vector<Node>::operator[](&local_30,local_94);
    uVar2 = local_1c;
    local_88 = pNVar8->frequency << 3;
    uVar10 = (ulong)pNVar8->front_similarity * (ulong)local_ac;
    uVar11 = (ulong)pNVar8->back_similarity * (ulong)local_b0;
    bVar12 = uVar10 - uVar11 == 0;
    bVar1 = uVar10 < uVar11 || bVar12;
    if (bVar1) {
      local_64 = local_64 + 1;
      puVar9 = vector<unsigned_short>::operator[](local_58,local_64);
      *puVar9 = uVar2;
      optimize_color_params::unpacked_endpoint::operator=
                ((unpacked_endpoint *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
                 (unpacked_endpoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
      ;
    }
    else {
      local_60 = local_60 - 1;
      puVar9 = vector<unsigned_short>::operator[](local_58,local_60);
      *puVar9 = uVar2;
      optimize_color_params::unpacked_endpoint::operator=
                ((unpacked_endpoint *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
                 (unpacked_endpoint *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
      ;
    }
    local_75 = uVar10 >= uVar11 && !bVar12;
    local_5c = local_5c - 1;
    in_stack_fffffffffffffe58 = vector<Node>::operator[](&local_30,local_5c);
    remap_color_endpoints::Node::operator=
              ((Node *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40),
               (Node *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  for (local_ca = (ushort)local_60; local_ca <= local_64; local_ca = local_ca + 1) {
    in_stack_fffffffffffffe46 = local_ca - (ushort)local_60;
    lVar13 = local_8;
    puVar9 = vector<unsigned_short>::operator[](local_58,(uint)local_ca);
    *(short *)(lVar13 + (ulong)*puVar9 * 2) = in_stack_fffffffffffffe46;
  }
  vector<unsigned_short>::~vector
            ((vector<unsigned_short> *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)
            );
  vector<Node>::~vector
            ((vector<Node> *)CONCAT26(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40));
  return;
}

Assistant:

static void remap_color_endpoints(uint16* remapping, const optimize_color_params::unpacked_endpoint* unpacked_endpoints, const uint* hist, uint16 n, uint16 selected, float weight) {
  struct Node {
    uint index, frequency, front_similarity, back_similarity;
    optimize_color_params::unpacked_endpoint e;
    Node() { utils::zero_object(*this); }
  };
  crnlib::vector<Node> remaining(n);
  for (uint16 i = 0; i < n; i++) {
    remaining[i].index = i;
    remaining[i].e = unpacked_endpoints[i];
  }
  crnlib::vector<uint16> chosen(n << 1);
  uint remaining_count = n, chosen_front = n, chosen_back = chosen_front;
  chosen[chosen_front] = selected;
  optimize_color_params::unpacked_endpoint front_e = remaining[selected].e, back_e = front_e;
  bool front_updated = true, back_updated = true;
  remaining[selected] = remaining[--remaining_count];
  const uint* frequency = hist + selected * n;

  for (uint similarity_base = (uint)(4000 * (1.0f + weight)), frequency_normalizer = 0; remaining_count;) {
    uint64 best_value = 0;
    uint best_index = 0;
    for (uint i = 0; i < remaining_count; i++) {
      Node& node = remaining[i];
      node.frequency += frequency[node.index];
      if (front_updated)
        node.front_similarity = similarity_base - math::minimum<uint>(4000, color::elucidian_distance(node.e.low, front_e.low, false) + color::elucidian_distance(node.e.high, front_e.high, false));
      if (back_updated)
        node.back_similarity = similarity_base - math::minimum<uint>(4000, color::elucidian_distance(node.e.low, back_e.low, false) + color::elucidian_distance(node.e.high, back_e.high, false));
      uint64 value = math::maximum(node.front_similarity, node.back_similarity) * (node.frequency + frequency_normalizer) + 1;
      if (value > best_value || (value == best_value && node.index < selected)) {
        best_value = value;
        best_index = i;
        selected = node.index;
      }
    }
    frequency = hist + selected * n;
    uint frequency_front = 0, frequency_back = 0;
    for (int front = chosen_front, back = chosen_back, scale = back - front; scale > 0; front++, back--, scale -= 2) {
      frequency_front += scale * frequency[chosen[front]];
      frequency_back += scale * frequency[chosen[back]];
    }
    front_updated = back_updated = false;
    Node& best_node = remaining[best_index];
    frequency_normalizer = best_node.frequency << 3;
    if ((uint64)best_node.front_similarity * frequency_front > (uint64)best_node.back_similarity * frequency_back) {
      chosen[--chosen_front] = selected;
      front_e = best_node.e;
      front_updated = true;
    } else {
      chosen[++chosen_back] = selected;
      back_e = best_node.e;
      back_updated = true;
    }
    best_node = remaining[--remaining_count];
  }

  for (uint16 i = chosen_front; i <= chosen_back; i++)
    remapping[chosen[i]] = i - chosen_front;
}